

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_each(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  jx9_value *pjVar4;
  jx9_value *pValue;
  anon_union_8_3_18420de5_for_x local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    puVar1 = (undefined8 *)((*apArg)->x).pOther;
    puVar2 = (undefined8 *)puVar1[4];
    if ((puVar2 != (undefined8 *)0x0) &&
       (pjVar4 = jx9_context_new_array(pCtx), pjVar4 != (jx9_value *)0x0)) {
      lVar3 = *(long *)*puVar2;
      if (*(uint *)(puVar2 + 7) < *(uint *)(lVar3 + 0x210)) {
        pValue = (jx9_value *)
                 ((ulong)(*(uint *)(puVar2 + 7) * *(int *)(lVar3 + 0x218)) +
                 *(long *)(lVar3 + 0x208));
      }
      else {
        pValue = (jx9_value *)0x0;
      }
      jx9_array_add_strkey_elem(pjVar4,"1",pValue);
      jx9_array_add_strkey_elem(pjVar4,"value",pValue);
      uStack_58 = *puVar1;
      local_50 = uStack_58;
      if (*(int *)(puVar2 + 1) == 1) {
        local_68 = *(anon_union_8_3_18420de5_for_x *)(puVar2 + 2);
        uStack_38 = 0;
        local_30 = 0;
        uStack_48 = 0;
        local_40 = 0;
        uStack_60 = 2;
      }
      else {
        local_68.rVal = 0.0;
        uStack_38 = 0;
        local_30 = 0;
        uStack_48 = 0;
        local_40 = 0;
        uStack_60 = 1;
        jx9MemObjStringAppend((jx9_value *)&local_68,(char *)puVar2[3],*(sxu32 *)(puVar2 + 4));
      }
      if ((pjVar4->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,(jx9_value *)0x0,(jx9_value *)&local_68);
      }
      jx9_array_add_strkey_elem(pjVar4,"key",(jx9_value *)&local_68);
      jx9MemObjRelease((jx9_value *)&local_68);
      puVar1[4] = puVar2[9];
      jx9MemObjStore(pjVar4,pCtx->pRet);
      return 0;
    }
  }
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_each(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pCur;
	jx9_hashmap *pMap;
	jx9_value *pArray;
	jx9_value *pVal;
	jx9_value sKey;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation that describe the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->pCur == 0 ){
		/* Cursor does not point to anything, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pCur = pMap->pCur;
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pVal = HashmapExtractNodeValue(pCur);
	/* Insert the current value */
	jx9_array_add_strkey_elem(pArray, "1", pVal);
	jx9_array_add_strkey_elem(pArray, "value", pVal);
	/* Make the key */
	if( pCur->iType == HASHMAP_INT_NODE ){
		jx9MemObjInitFromInt(pMap->pVm, &sKey, pCur->xKey.iKey);
	}else{
		jx9MemObjInitFromString(pMap->pVm, &sKey, 0);
		jx9MemObjStringAppend(&sKey, (const char *)SyBlobData(&pCur->xKey.sKey), SyBlobLength(&pCur->xKey.sKey));
	}
	/* Insert the current key */
	jx9_array_add_elem(pArray, 0, &sKey);
	jx9_array_add_strkey_elem(pArray, "key", &sKey);
	jx9MemObjRelease(&sKey);
	/* Advance the cursor */
	pMap->pCur = pCur->pPrev; /* Reverse link */
	/* Return the current entry */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}